

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::trySymlink
          (InMemoryDirectory *this,PathPtr path,StringPtr content,WriteMode mode)

{
  Impl *this_00;
  size_t sVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> this_01;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  char *pcVar7;
  String *pSVar8;
  StringPtr name;
  StringPtr name_00;
  StringPtr value;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Fault f;
  undefined1 local_60 [16];
  undefined1 local_50 [32];
  
  sVar6 = path.parts.size_;
  pSVar8 = path.parts.ptr;
  uVar5 = (ulong)mode;
  if (sVar6 == 1) {
    kj::_::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
    this_00 = &(this->impl).value;
    sVar6 = (pSVar8->content).size_;
    if (sVar6 == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pSVar8->content).ptr;
    }
    name.content.size_ = sVar6 + (sVar6 == 0);
    name.content.ptr = pcVar7;
    local_60._0_8_ = &this->impl;
    local_60._8_8_ = this_00;
    this_01 = Impl::openEntry(this_00,name,mode);
    uVar3 = this_01.ptr != (EntryImpl *)0x0;
    if ((bool)uVar3) {
      local_50._0_8_ = (*(code *)**(undefined8 **)this_00->clock)();
      value.content.size_ = uVar5;
      value.content.ptr = (char *)content.content.size_;
      heapString((String *)(local_50 + 8),(kj *)content.content.ptr,value);
      EntryImpl::init(this_01.ptr,(EVP_PKEY_CTX *)local_50);
      Array<char>::~Array((Array<char> *)(local_50 + 8));
      lVar4 = (*(code *)**(undefined8 **)this_00->clock)();
      (this->impl).value.lastModified.value.value = lVar4;
    }
    Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_60);
  }
  else if (sVar6 == 0) {
    if ((mode & CREATE) == 0) {
      uVar3 = 0;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4d4,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
      kj::_::Debug::Fault::~Fault((Fault *)local_50);
    }
    else {
      uVar3 = 0;
    }
  }
  else {
    sVar1 = (pSVar8->content).size_;
    if (sVar1 == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (pSVar8->content).ptr;
    }
    name_00.content.size_ = (size_t)pcVar7;
    name_00.content.ptr = (char *)this;
    tryGetParent((InMemoryDirectory *)local_60,name_00,(int)sVar1 + (uint)(sVar1 == 0));
    uVar2 = local_60._8_8_;
    local_50._0_8_ = local_60._0_8_;
    local_50._8_8_ = local_60._8_8_;
    local_60._8_8_ = (Impl *)0x0;
    Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)local_60);
    if ((Impl *)uVar2 == (Impl *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                ((Fault *)local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4e3,FAILED,(char *)0x0,"\"couldn\'t create parent directory\"",
                 (char (*) [33])"couldn\'t create parent directory");
      kj::_::Debug::Fault::~Fault((Fault *)local_60);
      uVar3 = 0;
    }
    else {
      uVar3 = (**(code **)(*(_func_int **)uVar2 + 0x98))
                        (uVar2,pSVar8 + 1,sVar6 - 1,(kj *)content.content.ptr,
                         (char *)content.content.size_,uVar5);
    }
    Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)local_50);
  }
  return (bool)uVar3;
}

Assistant:

bool trySymlink(PathPtr path, StringPtr content, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::CREATE)) {
        return false;
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return false; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(path[0], mode)) {
        entry->init(SymlinkNode { lock->clock.now(), heapString(content) });
        lock->modified();
        return true;
      } else {
        return false;
      }
    } else {
      KJ_IF_MAYBE(child, tryGetParent(path[0], mode)) {
        return child->get()->trySymlink(path.slice(1, path.size()), content, mode);
      } else {
        KJ_FAIL_REQUIRE("couldn't create parent directory") { return false; }
      }